

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::stmt_peek_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint32_t local_1c;
  InputAPI *pIStack_18;
  uint32_t ind_local;
  InputAPI *this_local;
  
  local_1c = ind;
  pIStack_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  indent_abi_cxx11_(&local_60,(re2c *)(ulong)ind,ind);
  expr_peek_save_abi_cxx11_(&local_80,this);
  std::operator+(&local_40,&local_60,&local_80);
  std::operator+(__return_storage_ptr__,&local_40,";\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_peek (uint32_t ind) const
{
	return indent (ind) + expr_peek_save () + ";\n";
}